

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmwavebs.cpp
# Opt level: O0

void __thiscall mmWaveBS::~mmWaveBS(mmWaveBS *this)

{
  bool bVar1;
  mmWaveBS *this_local;
  
  this->stop_thread = true;
  bVar1 = std::thread::joinable(&this->the_thread);
  if (bVar1) {
    std::thread::join();
  }
  std::thread::~thread(&this->the_thread);
  Signal<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Signal(&this->conflict);
  Signal<const_cluster_head_msg_&>::~Signal(&this->clusterHead);
  Signal<const_candidacy_msg_&>::~Signal(&this->candidacy);
  return;
}

Assistant:

mmWaveBS::~mmWaveBS()
{
	stop_thread = true;
	if(the_thread.joinable()) 
		the_thread.join();
// 	std::cout << "Deconstructor " << __FILE__ << std::endl;
}